

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O2

int run_test_tcp_bind_error_fault(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  char garbage [60];
  uv_tcp_t server;
  
  builtin_strncpy(garbage + 0x30,"h blah blah",0xc);
  builtin_strncpy(garbage + 0x20,"ah blah blah bla",0x10);
  builtin_strncpy(garbage + 0x10,"lah blah blah bl",0x10);
  builtin_strncpy(garbage,"blah blah blah b",0x10);
  puVar2 = uv_default_loop();
  iVar1 = uv_tcp_init(puVar2,&server);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_tcp_bind(&server,(sockaddr *)garbage,0);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a == -0x16) {
      uv_close((uv_handle_t *)&server,close_cb);
      puVar2 = uv_default_loop();
      uv_run(puVar2,UV_RUN_DEFAULT);
      eval_a = 1;
      eval_b = (int64_t)close_cb_called;
      if (eval_b == 1) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        eval_a = 0;
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        eval_b = (int64_t)iVar1;
        if (eval_b == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar5 = "uv_loop_close(uv_default_loop())";
        pcVar4 = "0";
        uVar3 = 0xb5;
      }
      else {
        pcVar5 = "close_cb_called";
        pcVar4 = "1";
        uVar3 = 0xb3;
      }
    }
    else {
      pcVar5 = "UV_EINVAL";
      pcVar4 = "r";
      uVar3 = 0xad;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "r";
    uVar3 = 0xab;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-bind-error.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(tcp_bind_error_fault) {
  char garbage[] =
      "blah blah blah blah blah blah blah blah blah blah blah blah";
  struct sockaddr_in* garbage_addr;
  uv_tcp_t server;
  int r;

  garbage_addr = (struct sockaddr_in*) &garbage;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT_OK(r);
  r = uv_tcp_bind(&server, (const struct sockaddr*) garbage_addr, 0);
  ASSERT_EQ(r, UV_EINVAL);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}